

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::Identity(ParsedScene *this,FileLoc loc)

{
  Transform *pTVar1;
  int i;
  uint i_00;
  Transform local_a8;
  
  if (this->currentApiState == Uninitialized) {
    Error<char_const(&)[9]>
              (&loc,"pbrtInit() must be before calling \"%s()\". Ignoring.",(char (*) [9])"Identity"
              );
  }
  else {
    for (i_00 = 0; i_00 != 2; i_00 = i_00 + 1) {
      if ((this->activeTransformBits >> (i_00 & 0x1f) & 1) != 0) {
        local_a8.mInv.m[0][0] = 0.0;
        local_a8.mInv.m[0][1] = 0.0;
        local_a8.mInv.m[0][2] = 0.0;
        local_a8.mInv.m[0][3] = 0.0;
        local_a8.mInv.m[1][0] = 0.0;
        local_a8.mInv.m[1][1] = 0.0;
        local_a8.mInv.m[1][2] = 0.0;
        local_a8.mInv.m[1][3] = 0.0;
        local_a8.mInv.m[2][0] = 0.0;
        local_a8.mInv.m[2][1] = 0.0;
        local_a8.mInv.m[2][2] = 0.0;
        local_a8.mInv.m[2][3] = 0.0;
        local_a8.mInv.m[3][0] = 0.0;
        local_a8.mInv.m[3][1] = 0.0;
        local_a8.mInv.m[3][2] = 0.0;
        local_a8.mInv.m[3][3] = 0.0;
        local_a8.m.m[0][0] = 0.0;
        local_a8.m.m[0][1] = 0.0;
        local_a8.m.m[0][2] = 0.0;
        local_a8.m.m[0][3] = 0.0;
        local_a8.m.m[1][0] = 0.0;
        local_a8.m.m[1][1] = 0.0;
        local_a8.m.m[1][2] = 0.0;
        local_a8.m.m[1][3] = 0.0;
        local_a8.m.m[2][0] = 0.0;
        local_a8.m.m[2][1] = 0.0;
        local_a8.m.m[2][2] = 0.0;
        local_a8.m.m[2][3] = 0.0;
        local_a8.m.m[3][0] = 0.0;
        local_a8.m.m[3][1] = 0.0;
        local_a8.m.m[3][2] = 0.0;
        local_a8.m.m[3][3] = 0.0;
        pbrt::Transform::Transform(&local_a8);
        pTVar1 = TransformSet::operator[](&this->curTransform,i_00);
        *(undefined8 *)(pTVar1->m).m[0] = local_a8.m.m[0]._0_8_;
        *(undefined8 *)((pTVar1->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
        *(undefined8 *)(pTVar1->m).m[1] = local_a8.m.m[1]._0_8_;
        *(undefined8 *)((pTVar1->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
        *(undefined8 *)(pTVar1->m).m[2] = local_a8.m.m[2]._0_8_;
        *(undefined8 *)((pTVar1->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
        *(undefined8 *)(pTVar1->m).m[3] = local_a8.m.m[3]._0_8_;
        *(undefined8 *)((pTVar1->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
      }
    }
  }
  return;
}

Assistant:

void ParsedScene::Identity(FileLoc loc) {
    VERIFY_INITIALIZED("Identity");
    FOR_ACTIVE_TRANSFORMS(curTransform[i] = pbrt::Transform();)
}